

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

void psa_aead_abort_internal(aead_operation_t *operation)

{
  if (operation->core_alg == 0x6401002) {
    mbedtls_gcm_free(&(operation->ctx).gcm);
    return;
  }
  if (operation->core_alg == 0x6401001) {
    mbedtls_ccm_free(&(operation->ctx).ccm);
    return;
  }
  return;
}

Assistant:

static void psa_aead_abort_internal( aead_operation_t *operation )
{
    switch( operation->core_alg )
    {
#if defined(MBEDTLS_CCM_C)
        case PSA_ALG_CCM:
            mbedtls_ccm_free( &operation->ctx.ccm );
            break;
#endif /* MBEDTLS_CCM_C */
#if defined(MBEDTLS_GCM_C)
        case PSA_ALG_GCM:
            mbedtls_gcm_free( &operation->ctx.gcm );
            break;
#endif /* MBEDTLS_GCM_C */
    }
}